

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

string * showClause_abi_cxx11_(Clause *c)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  Clause *in_RSI;
  string *in_RDI;
  int in_stack_0000003c;
  uint i;
  stringstream ss;
  int in_stack_fffffffffffffdfc;
  Clause *in_stack_fffffffffffffe00;
  string local_1d0 [52];
  uint local_19c;
  stringstream local_198 [16];
  ostream local_188 [376];
  Clause *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  local_19c = 0;
  while( true ) {
    uVar1 = local_19c;
    uVar2 = Clause::size(local_10);
    if (uVar2 <= uVar1) break;
    poVar3 = std::operator<<(local_188," ");
    in_stack_fffffffffffffe00 =
         (Clause *)Clause::operator[](in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
    in_stack_fffffffffffffdfc = toInt((Lit)*(int *)in_stack_fffffffffffffe00);
    getLitString_abi_cxx11_(in_stack_0000003c);
    std::operator<<(poVar3,local_1d0);
    std::__cxx11::string::~string(local_1d0);
    local_19c = local_19c + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string showClause(Clause& c) {
	std::stringstream ss;
	for (unsigned int i = 0; i < c.size(); i++) {
		ss << " " << getLitString(toInt(c[i]));
	}
	return ss.str();
}